

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O2

void p_ini_file_free(PIniFile *file)

{
  if (file != (PIniFile *)0x0) {
    p_list_foreach(file->sections,pp_ini_file_section_free,(ppointer)0x0);
    p_list_free(file->sections);
    p_free(file->path);
    p_free(file);
    return;
  }
  return;
}

Assistant:

P_LIB_API void
p_ini_file_free (PIniFile *file)
{
	if (P_UNLIKELY (file == NULL))
		return;

	p_list_foreach (file->sections, (PFunc) pp_ini_file_section_free, NULL);
	p_list_free (file->sections);
	p_free (file->path);
	p_free (file);
}